

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_quaternion.c
# Opt level: O1

char * test_quaternion_slerp(void)

{
  int iVar1;
  vector3 *pvVar2;
  char *pcVar3;
  quaternion q3;
  quaternion q1;
  quaternion q;
  quaternion q2;
  quaternion local_a0;
  quaternion local_80;
  quaternion local_60;
  quaternion local_40;
  
  pvVar2 = vector3_get_reference_vector3(1);
  quaternion_set_from_axis_anglev3(&local_80,pvVar2,1.5707963705062866);
  pvVar2 = vector3_get_reference_vector3(1);
  quaternion_set_from_axis_anglev3(&local_40,pvVar2,1.7278760450076192);
  pvVar2 = vector3_get_reference_vector3(1);
  quaternion_set_from_axis_anglev3(&local_a0,pvVar2,1.8849557195089517);
  quaternion_slerp(&local_80,&local_a0,0.5,&local_60);
  iVar1 = quaternion_equals(&local_60,&local_40);
  if (iVar1 == 0) {
    pcVar3 = 
    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(259) : (assertion failed) ((quaternion_equals(&q, &q2)))"
    ;
  }
  else {
    quaternion_slerp(&local_80,&local_a0,0.0,&local_60);
    iVar1 = quaternion_equals(&local_60,&local_80);
    if (iVar1 == 0) {
      pcVar3 = 
      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(263) : (assertion failed) ((quaternion_equals(&q, &q1)))"
      ;
    }
    else {
      quaternion_slerp(&local_80,&local_a0,1.0,&local_60);
      iVar1 = quaternion_equals(&local_60,&local_a0);
      if (iVar1 == 0) {
        pcVar3 = 
        "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(267) : (assertion failed) ((quaternion_equals(&q, &q3)))"
        ;
      }
      else {
        quaternion_slerp(&local_a0,&local_80,0.5,&local_60);
        iVar1 = quaternion_equals(&local_60,&local_40);
        if (iVar1 == 0) {
          pcVar3 = 
          "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(272) : (assertion failed) ((quaternion_equals(&q, &q2)))"
          ;
        }
        else {
          quaternion_slerp(&local_a0,&local_80,0.0,&local_60);
          iVar1 = quaternion_equals(&local_60,&local_a0);
          if (iVar1 == 0) {
            pcVar3 = 
            "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(276) : (assertion failed) ((quaternion_equals(&q, &q3)))"
            ;
          }
          else {
            quaternion_slerp(&local_a0,&local_80,1.0,&local_60);
            iVar1 = quaternion_equals(&local_60,&local_80);
            if (iVar1 == 0) {
              pcVar3 = 
              "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(280) : (assertion failed) ((quaternion_equals(&q, &q1)))"
              ;
            }
            else {
              pvVar2 = vector3_get_reference_vector3(1);
              quaternion_set_from_axis_anglev3(&local_80,pvVar2,1.5707963705062866);
              pvVar2 = vector3_get_reference_vector3(1);
              quaternion_set_from_axis_anglev3(&local_40,pvVar2,1.413716696004954);
              pvVar2 = vector3_get_reference_vector3(1);
              quaternion_set_from_axis_anglev3(&local_a0,pvVar2,1.2566371151303812);
              quaternion_slerp(&local_80,&local_a0,0.5,&local_60);
              iVar1 = quaternion_equals(&local_60,&local_40);
              if (iVar1 == 0) {
                pcVar3 = 
                "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(290) : (assertion failed) ((quaternion_equals(&q, &q2)))"
                ;
              }
              else {
                quaternion_slerp(&local_80,&local_a0,0.0,&local_60);
                iVar1 = quaternion_equals(&local_60,&local_80);
                if (iVar1 == 0) {
                  pcVar3 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(294) : (assertion failed) ((quaternion_equals(&q, &q1)))"
                  ;
                }
                else {
                  quaternion_slerp(&local_80,&local_a0,1.0,&local_60);
                  iVar1 = quaternion_equals(&local_60,&local_a0);
                  if (iVar1 == 0) {
                    pcVar3 = 
                    "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(298) : (assertion failed) ((quaternion_equals(&q, &q3)))"
                    ;
                  }
                  else {
                    quaternion_slerp(&local_a0,&local_80,0.5,&local_60);
                    iVar1 = quaternion_equals(&local_60,&local_40);
                    if (iVar1 == 0) {
                      pcVar3 = 
                      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(303) : (assertion failed) ((quaternion_equals(&q, &q2)))"
                      ;
                    }
                    else {
                      quaternion_slerp(&local_a0,&local_80,0.0,&local_60);
                      iVar1 = quaternion_equals(&local_60,&local_a0);
                      if (iVar1 == 0) {
                        pcVar3 = 
                        "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(307) : (assertion failed) ((quaternion_equals(&q, &q3)))"
                        ;
                      }
                      else {
                        quaternion_slerp(&local_a0,&local_80,1.0,&local_60);
                        iVar1 = quaternion_equals(&local_60,&local_80);
                        pcVar3 = (char *)0x0;
                        if (iVar1 == 0) {
                          pcVar3 = 
                          "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_quaternion.c(311) : (assertion failed) ((quaternion_equals(&q, &q1)))"
                          ;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return pcVar3;
}

Assistant:

static char *test_quaternion_slerp(void)
{
	struct quaternion q, q1, q2, q3;
	HYP_FLOAT angle;

	angle = HYP_TAU / 4.0f;

	quaternion_set_from_axis_anglev3(&q1, HYP_VECTOR3_UNIT_X, angle);
	quaternion_set_from_axis_anglev3(&q2, HYP_VECTOR3_UNIT_X, angle * 1.1f);
	quaternion_set_from_axis_anglev3(&q3, HYP_VECTOR3_UNIT_X, angle * 1.2f);

	/* half-way */
	quaternion_slerp(&q1, &q3, 0.5f, &q);
	test_assert(quaternion_equals(&q, &q2));

	/* none */
	quaternion_slerp(&q1, &q3, 0.0f, &q);
	test_assert(quaternion_equals(&q, &q1));

	/* all the way */
	quaternion_slerp(&q1, &q3, 1.0f, &q);
	test_assert(quaternion_equals(&q, &q3));


	/* swap order half-way */
	quaternion_slerp(&q3, &q1, 0.5f, &q);
	test_assert(quaternion_equals(&q, &q2));

	/* swap order none */
	quaternion_slerp(&q3, &q1, 0.0f, &q);
	test_assert(quaternion_equals(&q, &q3));

	/* swap order all the way */
	quaternion_slerp(&q3, &q1, 1.0f, &q);
	test_assert(quaternion_equals(&q, &q1));


	/* go reverse around the sphere */
	quaternion_set_from_axis_anglev3(&q1, HYP_VECTOR3_UNIT_X, angle);
	quaternion_set_from_axis_anglev3(&q2, HYP_VECTOR3_UNIT_X, angle * 0.9f);
	quaternion_set_from_axis_anglev3(&q3, HYP_VECTOR3_UNIT_X, angle * 0.8f);

	/* go reverse half-way */
	quaternion_slerp(&q1, &q3, 0.5f, &q);
	test_assert(quaternion_equals(&q, &q2));

	/* go reverse none */
	quaternion_slerp(&q1, &q3, 0.0f, &q);
	test_assert(quaternion_equals(&q, &q1));

	/* go reverse all the way */
	quaternion_slerp(&q1, &q3, 1.0f, &q);
	test_assert(quaternion_equals(&q, &q3));


	/* swap order reverse half-way */
	quaternion_slerp(&q3, &q1, 0.5f, &q);
	test_assert(quaternion_equals(&q, &q2));

	/* swap order reverse none */
	quaternion_slerp(&q3, &q1, 0.0f, &q);
	test_assert(quaternion_equals(&q, &q3));

	/* swap order reverse all the way */
	quaternion_slerp(&q3, &q1, 1.0f, &q);
	test_assert(quaternion_equals(&q, &q1));

	return NULL;
}